

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O2

int Imf_3_4::anon_unknown_5::viewNum(string *view,StringVector *multiView)

{
  pointer pbVar1;
  __type _Var2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    pbVar1 = (multiView->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(multiView->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4) {
      return -1;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar3),view);
    if (_Var2) break;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x20;
  }
  return (int)uVar4;
}

Assistant:

int
viewNum (const string& view, const StringVector& multiView)
{
    //
    // returns which view number is called 'view'
    // returns -1 if no member of multiView is 'view'
    // (i.e. if viewNum() returns -1, 'view' isn't a view name
    //       if viewNum() returns 0, 'view' is the default view
    // otherwise, it's some other (valid) view
    //

    for (size_t i = 0; i < multiView.size (); ++i)
    {
        if (multiView[i] == view) return i;
    }

    return -1;
}